

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

bool __thiscall mkvparser::CuePoint::Load(CuePoint *this,IMkvReader *pReader)

{
  TrackPosition *pTVar1;
  undefined1 auVar2 [16];
  TrackPosition *pReader_00;
  CuePoint *pCVar3;
  bool bVar4;
  longlong lVar5;
  longlong lVar6;
  bool bVar7;
  long lVar8;
  ulong uVar9;
  long unaff_R12;
  long pos;
  long lVar10;
  long len;
  long local_68;
  TrackPosition *local_60;
  long local_58;
  CuePoint *local_50;
  ulong local_48;
  longlong local_40;
  longlong local_38;
  
  lVar10 = this->m_timecode;
  if (-1 < lVar10) {
    return true;
  }
  local_60 = (TrackPosition *)pReader;
  if (this->m_track_positions != (TrackPosition *)0x0) {
    __assert_fail("m_track_positions == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x8e7,"bool mkvparser::CuePoint::Load(IMkvReader *)");
  }
  if (this->m_track_positions_count != 0) {
    __assert_fail("m_track_positions_count == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x8e8,"bool mkvparser::CuePoint::Load(IMkvReader *)");
  }
  pos = -lVar10;
  lVar5 = ReadID(pReader,pos,&local_68);
  lVar8 = pos;
  if (lVar5 == 0xbb) {
    lVar8 = local_68 - lVar10;
    lVar6 = ReadUInt((IMkvReader *)local_60,lVar8,&local_68);
    if (lVar6 < 0) {
      __assert_fail("size >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x8f9,"bool mkvparser::CuePoint::Load(IMkvReader *)");
    }
    lVar8 = lVar8 + local_68;
    unaff_R12 = lVar6 + lVar8;
  }
  if (lVar5 == 0xbb) {
    local_38 = lVar10 + unaff_R12;
    local_48 = 0;
    bVar7 = false;
    local_58 = lVar8;
    local_50 = this;
    local_40 = pos;
    while (pCVar3 = local_50, pReader_00 = local_60, lVar8 < unaff_R12) {
      lVar5 = ReadID((IMkvReader *)local_60,lVar8,&local_68);
      lVar10 = lVar8;
      if ((((lVar5 < 0) || (lVar8 = local_68 + lVar8, unaff_R12 < lVar8)) ||
          (lVar6 = ReadUInt((IMkvReader *)pReader_00,lVar8,&local_68), lVar10 = lVar8, lVar6 < 0))
         || ((lVar8 = local_68 + lVar8, unaff_R12 < lVar8 ||
             (lVar10 = lVar8, unaff_R12 < lVar8 + lVar6)))) {
        bVar4 = false;
        bVar7 = false;
        lVar8 = lVar10;
      }
      else {
        if (lVar5 == 0xb7) {
          local_48 = local_48 + 1;
          if (local_48 >> 0x20 != 0) {
            bVar7 = true;
            bVar4 = false;
            goto LAB_00112a1f;
          }
        }
        else if (lVar5 == 0xb3) {
          lVar5 = UnserializeUInt((IMkvReader *)local_60,lVar8,lVar6);
          local_50->m_timecode = lVar5;
        }
        bVar4 = true;
        lVar8 = lVar8 + lVar6;
      }
LAB_00112a1f:
      if (!bVar4) {
        return bVar7;
      }
    }
    local_50->m_track_positions_count = local_48;
    if (local_48 != 0 && -1 < local_50->m_timecode) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_48;
      uVar9 = 0xffffffffffffffff;
      if (SUB168(auVar2 * ZEXT816(0x18),8) == 0) {
        uVar9 = SUB168(auVar2 * ZEXT816(0x18),0);
      }
      local_60 = (TrackPosition *)operator_new__(uVar9,(nothrow_t *)&std::nothrow);
      pCVar3->m_track_positions = local_60;
      if (local_60 != (TrackPosition *)0x0) {
        do {
          lVar10 = local_58;
          if (unaff_R12 <= local_58) {
            if (((long)local_60 - (long)local_50->m_track_positions >> 3) * -0x5555555555555555 -
                local_50->m_track_positions_count == 0) {
              local_50->m_element_start = local_40;
              local_50->m_element_size = local_38;
              return true;
            }
            __assert_fail("size_t(p - m_track_positions) == m_track_positions_count",
                          "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                          ,0x956,"bool mkvparser::CuePoint::Load(IMkvReader *)");
          }
          lVar5 = ReadID((IMkvReader *)pReader_00,local_58,&local_68);
          if ((lVar5 < 0) || (lVar10 = local_68 + lVar10, unaff_R12 < lVar10)) {
            bVar4 = false;
            bVar7 = false;
          }
          else {
            lVar6 = ReadUInt((IMkvReader *)pReader_00,lVar10,&local_68);
            if (lVar6 < 0) {
              __assert_fail("size >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                            ,0x944,"bool mkvparser::CuePoint::Load(IMkvReader *)");
            }
            lVar10 = lVar10 + local_68;
            if (unaff_R12 < lVar10) {
              __assert_fail("(pos + len) <= stop",
                            "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                            ,0x945,"bool mkvparser::CuePoint::Load(IMkvReader *)");
            }
            local_58 = lVar6 + lVar10;
            if (unaff_R12 < local_58) {
              __assert_fail("(pos + size) <= stop",
                            "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                            ,0x948,"bool mkvparser::CuePoint::Load(IMkvReader *)");
            }
            bVar4 = true;
            if (lVar5 == 0xb7) {
              pTVar1 = local_60 + 1;
              bVar4 = TrackPosition::Parse(local_60,(IMkvReader *)pReader_00,lVar10,lVar6);
              bVar7 = (bool)(bVar7 & bVar4);
              local_60 = pTVar1;
              if (!bVar4) {
                local_58 = lVar10;
              }
            }
          }
          if (bVar4 == false) {
            return bVar7;
          }
        } while( true );
      }
    }
  }
  return false;
}

Assistant:

bool CuePoint::Load(IMkvReader* pReader) {
  // odbgstream os;
  // os << "CuePoint::Load(begin): timecode=" << m_timecode << endl;

  if (m_timecode >= 0)  // already loaded
    return true;

  assert(m_track_positions == NULL);
  assert(m_track_positions_count == 0);

  long long pos_ = -m_timecode;
  const long long element_start = pos_;

  long long stop;

  {
    long len;

    const long long id = ReadID(pReader, pos_, len);
    if (id != libwebm::kMkvCuePoint)
      return false;

    pos_ += len;  // consume ID

    const long long size = ReadUInt(pReader, pos_, len);
    assert(size >= 0);

    pos_ += len;  // consume Size field
    // pos_ now points to start of payload

    stop = pos_ + size;
  }

  const long long element_size = stop - element_start;

  long long pos = pos_;

  // First count number of track positions
  unsigned long long track_positions_count = 0;
  while (pos < stop) {
    long len;

    const long long id = ReadID(pReader, pos, len);
    if ((id < 0) || (pos + len > stop)) {
      return false;
    }

    pos += len;  // consume ID

    const long long size = ReadUInt(pReader, pos, len);
    if ((size < 0) || (pos + len > stop)) {
      return false;
    }

    pos += len;  // consume Size field
    if ((pos + size) > stop) {
      return false;
    }

    if (id == libwebm::kMkvCueTime)
      m_timecode = UnserializeUInt(pReader, pos, size);

    else if (id == libwebm::kMkvCueTrackPositions) {
      ++track_positions_count;
      if (track_positions_count > UINT_MAX)
        return E_PARSE_FAILED;
    }

    pos += size;  // consume payload
  }

  m_track_positions_count = static_cast<size_t>(track_positions_count);

  if (m_timecode < 0 || m_track_positions_count <= 0) {
    return false;
  }

  // os << "CuePoint::Load(cont'd): idpos=" << idpos
  //   << " timecode=" << m_timecode
  //   << endl;

  m_track_positions = new (std::nothrow) TrackPosition[m_track_positions_count];
  if (m_track_positions == NULL)
    return false;

  // Now parse track positions

  TrackPosition* p = m_track_positions;
  pos = pos_;

  while (pos < stop) {
    long len;

    const long long id = ReadID(pReader, pos, len);
    if (id < 0 || (pos + len) > stop)
      return false;

    pos += len;  // consume ID

    const long long size = ReadUInt(pReader, pos, len);
    assert(size >= 0);
    assert((pos + len) <= stop);

    pos += len;  // consume Size field
    assert((pos + size) <= stop);

    if (id == libwebm::kMkvCueTrackPositions) {
      TrackPosition& tp = *p++;
      if (!tp.Parse(pReader, pos, size)) {
        return false;
      }
    }

    pos += size;  // consume payload
    if (pos > stop)
      return false;
  }

  assert(size_t(p - m_track_positions) == m_track_positions_count);

  m_element_start = element_start;
  m_element_size = element_size;

  return true;
}